

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::PaddingLayerParams::ByteSizeLong(PaddingLayerParams *this)

{
  uint32 uVar1;
  long lVar2;
  size_t sVar3;
  
  if (this->paddingamounts_ == (BorderAmounts *)0x0 ||
      this == (PaddingLayerParams *)&_PaddingLayerParams_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BorderAmounts>(this->paddingamounts_);
    sVar3 = sVar3 + 1;
  }
  uVar1 = this->_oneof_case_[0];
  if ((uVar1 == 3) || (uVar1 == 2)) {
    ((this->PaddingType_).constant_)->value_ = 0.0;
    sVar3 = sVar3 + 2;
  }
  else if (uVar1 == 1) {
    lVar2 = (ulong)(-(uint)(((this->PaddingType_).constant_)->value_ != 0.0) & 1) * 5;
    ((this->PaddingType_).constant_)->_cached_size_ = (int)lVar2;
    sVar3 = sVar3 + lVar2 + 2;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t PaddingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PaddingLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
  if (this->has_paddingamounts()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->paddingamounts_);
  }

  switch (PaddingType_case()) {
    // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
    case kConstant: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PaddingType_.constant_);
      break;
    }
    // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
    case kReflection: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PaddingType_.reflection_);
      break;
    }
    // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
    case kReplication: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PaddingType_.replication_);
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}